

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

string * __thiscall
pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,PyTypeObject *type)

{
  char *__s;
  allocator<char> local_19;
  detail *local_18;
  PyTypeObject *type_local;
  
  __s = *(char **)(this + 0x18);
  local_18 = this;
  type_local = (PyTypeObject *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_19)
  ;
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

inline std::string get_fully_qualified_tp_name(PyTypeObject *type) {
#if !defined(PYPY_VERSION)
    return type->tp_name;
#else
    auto module_name = handle((PyObject *) type).attr("__module__").cast<std::string>();
    if (module_name == PYBIND11_BUILTINS_MODULE)
        return type->tp_name;
    else
        return std::move(module_name) + "." + type->tp_name;
#endif
}